

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

jsparser_ctx * ctemplate_htmlparser::jsparser_duplicate(jsparser_ctx *src)

{
  jsparser_ctx *dst;
  jsparser_ctx *src_local;
  
  if (src != (jsparser_ctx *)0x0) {
    src_local = jsparser_new();
    if (src_local == (jsparser_ctx *)0x0) {
      src_local = (jsparser_ctx *)0x0;
    }
    else {
      jsparser_copy(src_local,src);
    }
    return src_local;
  }
  __assert_fail("src != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,600,"jsparser_ctx *ctemplate_htmlparser::jsparser_duplicate(jsparser_ctx *)");
}

Assistant:

jsparser_ctx *jsparser_duplicate(jsparser_ctx *src)
{
  jsparser_ctx *dst;
  assert(src != NULL);

  dst = jsparser_new();
  if (dst == NULL)
    return NULL;

  jsparser_copy(dst, src);

  return dst;
}